

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O2

int run_test_active(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_is_active((uv_handle_t *)&timer);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_is_closing((uv_handle_t *)&timer);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          eval_a = 1;
          iVar1 = uv_is_active((uv_handle_t *)&timer);
          eval_b = (int64_t)iVar1;
          if (eval_b == 1) {
            iVar1 = uv_is_closing((uv_handle_t *)&timer);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = uv_timer_stop(&timer);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                iVar1 = uv_is_active((uv_handle_t *)&timer);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  iVar1 = uv_is_closing((uv_handle_t *)&timer);
                  eval_a = (int64_t)iVar1;
                  eval_b = 0;
                  if (eval_a == 0) {
                    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
                    eval_a = (int64_t)iVar1;
                    eval_b = 0;
                    if (eval_a == 0) {
                      eval_a = 1;
                      iVar1 = uv_is_active((uv_handle_t *)&timer);
                      eval_b = (int64_t)iVar1;
                      if (eval_b == 1) {
                        iVar1 = uv_is_closing((uv_handle_t *)&timer);
                        eval_a = (int64_t)iVar1;
                        eval_b = 0;
                        if (eval_a == 0) {
                          uv_close((uv_handle_t *)&timer,close_cb);
                          iVar1 = uv_is_active((uv_handle_t *)&timer);
                          eval_a = (int64_t)iVar1;
                          eval_b = 0;
                          if (eval_a == 0) {
                            eval_a = 1;
                            iVar1 = uv_is_closing((uv_handle_t *)&timer);
                            eval_b = (int64_t)iVar1;
                            if (eval_b == 1) {
                              puVar2 = uv_default_loop();
                              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                              eval_a = (int64_t)iVar1;
                              eval_b = 0;
                              if (eval_a == 0) {
                                eval_a = 1;
                                eval_b = (int64_t)close_cb_called;
                                if (eval_b == 1) {
                                  puVar2 = uv_default_loop();
                                  uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                  uv_run(puVar2,UV_RUN_DEFAULT);
                                  eval_a = 0;
                                  puVar2 = uv_default_loop();
                                  iVar1 = uv_loop_close(puVar2);
                                  eval_b = (int64_t)iVar1;
                                  if (eval_b == 0) {
                                    uv_library_shutdown();
                                    return 0;
                                  }
                                  pcVar4 = "uv_loop_close(uv_default_loop())";
                                  pcVar3 = "0";
                                  uVar5 = 0x52;
                                }
                                else {
                                  pcVar4 = "close_cb_called";
                                  pcVar3 = "1";
                                  uVar5 = 0x50;
                                }
                              }
                              else {
                                pcVar4 = "0";
                                pcVar3 = "r";
                                uVar5 = 0x4e;
                              }
                            }
                            else {
                              pcVar4 = "uv_is_closing((uv_handle_t*) &timer)";
                              pcVar3 = "1";
                              uVar5 = 0x4b;
                            }
                          }
                          else {
                            pcVar4 = "0";
                            pcVar3 = "uv_is_active((uv_handle_t*) &timer)";
                            uVar5 = 0x4a;
                          }
                        }
                        else {
                          pcVar4 = "0";
                          pcVar3 = "uv_is_closing((uv_handle_t*) &timer)";
                          uVar5 = 0x46;
                        }
                      }
                      else {
                        pcVar4 = "uv_is_active((uv_handle_t*) &timer)";
                        pcVar3 = "1";
                        uVar5 = 0x45;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "r";
                      uVar5 = 0x43;
                    }
                  }
                  else {
                    pcVar4 = "0";
                    pcVar3 = "uv_is_closing((uv_handle_t*) &timer)";
                    uVar5 = 0x40;
                  }
                }
                else {
                  pcVar4 = "0";
                  pcVar3 = "uv_is_active((uv_handle_t*) &timer)";
                  uVar5 = 0x3f;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "r";
                uVar5 = 0x3d;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_is_closing((uv_handle_t*) &timer)";
              uVar5 = 0x3a;
            }
          }
          else {
            pcVar4 = "uv_is_active((uv_handle_t*) &timer)";
            pcVar3 = "1";
            uVar5 = 0x39;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x37;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_is_closing((uv_handle_t*) &timer)";
        uVar5 = 0x34;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_is_active((uv_handle_t*) &timer)";
      uVar5 = 0x33;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar5 = 0x30;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-active.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT_OK(r);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT_OK(r);

  ASSERT_EQ(1, uv_is_active((uv_handle_t*) &timer));
  ASSERT_OK(uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT_OK(uv_is_active((uv_handle_t*) &timer));
  ASSERT_EQ(1, uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}